

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall mocker::DuplicatedSymbols::~DuplicatedSymbols(DuplicatedSymbols *this)

{
  DuplicatedSymbols *this_local;
  
  *(undefined ***)&this->super_CompileError = &PTR__DuplicatedSymbols_0039ea88;
  std::__cxx11::string::~string((string *)&this->msg);
  CompileError::~CompileError(&this->super_CompileError);
  return;
}

Assistant:

DuplicatedSymbols(const Position &beg, const Position &end,
                    const std::string &symName)
      : CompileError(beg, end) {
    msg = std::string(CompileError::what()) + ". Symbol: " + symName;
  }